

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O2

void mempool_stats(mempool *pool,mempool_stats *stats)

{
  uint uVar1;
  ulong uVar2;
  uint32_t uVar3;
  ulong uVar4;
  
  uVar1 = pool->objsize;
  stats->objsize = uVar1;
  stats->objcount = (uint32_t)((pool->slabs).stats.used / (ulong)uVar1);
  uVar4 = slab_order_size(pool->cache,pool->slab_order);
  stats->slabsize = (uint32_t)uVar4;
  uVar2 = (pool->slabs).stats.total;
  uVar3 = (uint32_t)(uVar2 / (uVar4 & 0xffffffff));
  stats->slabcount = uVar3;
  (stats->totals).used = (pool->slabs).stats.used;
  (stats->totals).total = uVar2 - uVar3 * 0x70;
  return;
}

Assistant:

void
mempool_stats(struct mempool *pool, struct mempool_stats *stats)
{
	/* Object size. */
	stats->objsize = pool->objsize;
	/* Number of objects. */
	stats->objcount = mempool_count(pool);
	/* Size of the slab. */
	stats->slabsize = slab_order_size(pool->cache, pool->slab_order);
	/* The number of slabs. */
	stats->slabcount = pool->slabs.stats.total/stats->slabsize;
	/* How much memory is used for slabs. */
	stats->totals.used = pool->slabs.stats.used;
	/*
	 * How much memory is available. Subtract the slab size,
	 * which is allocation overhead and is not available
	 * memory.
	 */
	stats->totals.total = pool->slabs.stats.total -
		mslab_sizeof() * stats->slabcount;
}